

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

void P_LineOpening(FLineOpening *open,AActor *actor,line_t *linedef,DVector2 *pos,DVector2 *ref,
                  int flags)

{
  sector_t *this;
  sector_t *this_00;
  double dVar1;
  bool bVar2;
  int iVar3;
  sector_t *psVar4;
  double dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  
  if ((flags & 4U) == 0) {
    this = linedef->backsector;
    if (this == (sector_t *)0x0) {
      dVar9 = 0.0;
      goto LAB_0054656f;
    }
    this_00 = linedef->frontsector;
    dVar9 = 0.0;
    if ((flags & 0x10U) == 0) {
      dVar5 = 0.0;
      dVar8 = 0.0;
      if (-1 < (int)linedef->flags) goto LAB_0054625c;
      dVar5 = 3.4028234663852886e+38;
      uVar6 = 0xe0000000;
      uVar7 = 0x47efffff;
      if ((this_00->planes[1].Flags & 0x1d0U) != 0x100) {
        uVar6 = 0;
        uVar7 = 0;
      }
      if ((this->planes[1].Flags & 0x1d0U) != 0x100) {
        dVar5 = 0.0;
      }
      dVar8 = -3.4028234663852886e+38;
      dVar9 = -3.4028234663852886e+38;
      if ((this_00->planes[0].Flags & 0x1d0U) != 0x100) {
        dVar9 = 0.0;
      }
      if ((this->planes[0].Flags & 0x1d0U) != 0x100) {
        dVar8 = 0.0;
      }
      dVar1 = (double)CONCAT44(uVar7,uVar6);
      if (((double)CONCAT44(uVar7,uVar6) == 0.0) &&
         (dVar1 = (double)CONCAT44(uVar7,uVar6), !NAN((double)CONCAT44(uVar7,uVar6))))
      goto LAB_0054625c;
    }
    else {
      dVar5 = 0.0;
      dVar8 = 0.0;
LAB_0054625c:
      dVar1 = (pos->Y * (this_00->ceilingplane).normal.Y +
              (this_00->ceilingplane).D + pos->X * (this_00->ceilingplane).normal.X) *
              (this_00->ceilingplane).negiC;
    }
    if ((dVar5 == 0.0) && (!NAN(dVar5))) {
      dVar5 = (pos->Y * (this->ceilingplane).normal.Y +
              (this->ceilingplane).D + pos->X * (this->ceilingplane).normal.X) *
              (this->ceilingplane).negiC;
    }
    if ((dVar9 == 0.0) && (!NAN(dVar9))) {
      dVar9 = (pos->Y * (this_00->floorplane).normal.Y +
              (this_00->floorplane).D + pos->X * (this_00->floorplane).normal.X) *
              (this_00->floorplane).negiC;
    }
    if ((dVar8 == 0.0) && (!NAN(dVar8))) {
      dVar8 = (pos->Y * (this->floorplane).normal.Y +
              (this->floorplane).D + pos->X * (this->floorplane).normal.X) *
              (this->floorplane).negiC;
    }
    psVar4 = this;
    if (dVar1 < dVar5) {
      psVar4 = this_00;
    }
    open->topsec = psVar4;
    (open->ceilingpic).texnum = psVar4->planes[1].Texture.texnum;
    if (dVar5 <= dVar1) {
      dVar1 = dVar5;
    }
    open->top = dVar1;
    if ((((ref == (DVector2 *)0x0) || ((dVar9 == -1.1754943508222875e-38 && (!NAN(dVar9))))) ||
        ((dVar8 == -1.1754943508222875e-38 && (!NAN(dVar8))))) || (0.00390625 < ABS(dVar9 - dVar8)))
    {
      if (dVar8 < dVar9) goto LAB_00546423;
LAB_005463a1:
      open->bottom = dVar8;
      open->bottomsec = this;
      (open->floorpic).texnum = this->planes[0].Texture.texnum;
      iVar3 = sector_t::GetTerrain(this,0);
      open->floorterrain = iVar3;
      dVar8 = dVar9;
      if ((dVar9 != -1.1754943508222875e-38) || (psVar4 = this_00, NAN(dVar9))) goto LAB_005464a2;
joined_r0x00546462:
      if (((uint)flags >> 8 & 1) == 0) {
        dVar8 = sector_t::NextLowestFloorAt
                          (psVar4,pos->X,pos->Y,
                           sectorPortals.Array[psVar4->Portals[0]].mPlaneZ + -1.52587890625e-05,0,
                           0.0,(sector_t **)0x0,(F3DFloor **)0x0);
        goto LAB_005464a2;
      }
    }
    else {
      dVar5 = (this_00->floorplane).normal.X;
      if (((((dVar5 != 0.0) || (NAN(dVar5))) ||
           (dVar5 = (this_00->floorplane).normal.Y, dVar5 != 0.0)) || (NAN(dVar5))) &&
         ((((dVar5 = (this->floorplane).normal.X, dVar5 == 0.0 && (!NAN(dVar5))) &&
           ((dVar5 = (this->floorplane).normal.Y, dVar5 == 0.0 && (!NAN(dVar5))))) ||
          (iVar3 = P_PointOnLineSide(ref,linedef), iVar3 != 0)))) goto LAB_005463a1;
LAB_00546423:
      open->bottom = dVar9;
      open->bottomsec = this_00;
      (open->floorpic).texnum = this_00->planes[0].Texture.texnum;
      iVar3 = sector_t::GetTerrain(this_00,0);
      open->floorterrain = iVar3;
      if ((dVar8 == -1.1754943508222875e-38) && (psVar4 = this, !NAN(dVar8)))
      goto joined_r0x00546462;
LAB_005464a2:
      open->lowfloor = dVar8;
    }
    (open->frontfloorplane).normal.Z = (this_00->floorplane).normal.Z;
    dVar9 = (this_00->floorplane).normal.Y;
    (open->frontfloorplane).normal.X = (this_00->floorplane).normal.X;
    (open->frontfloorplane).normal.Y = dVar9;
    dVar9 = (this_00->floorplane).negiC;
    (open->frontfloorplane).D = (this_00->floorplane).D;
    (open->frontfloorplane).negiC = dVar9;
    (open->backfloorplane).normal.Z = (this->floorplane).normal.Z;
    dVar9 = (this->floorplane).normal.Y;
    (open->backfloorplane).normal.X = (this->floorplane).normal.X;
    (open->backfloorplane).normal.Y = dVar9;
    dVar9 = (this->floorplane).negiC;
    (open->backfloorplane).D = (this->floorplane).D;
    (open->backfloorplane).negiC = dVar9;
  }
  else {
    open->ceilingpic = -1;
    open->floorpic = -1;
    open->bottomsec = (sector_t *)0x0;
    open->topsec = (sector_t *)0x0;
    open->floorterrain = -1;
    open->top = 3.4028234663852886e+38;
    open->bottom = -3.4028234663852886e+38;
    open->lowfloor = 3.4028234663852886e+38;
    (open->frontfloorplane).normal.X = 0.0;
    (open->frontfloorplane).normal.Y = 0.0;
    (open->frontfloorplane).negiC = -1.0;
    (open->frontfloorplane).normal.Z = 1.0;
    (open->frontfloorplane).D = 3.4028234663852886e+38;
    (open->backfloorplane).normal.X = 0.0;
    (open->backfloorplane).normal.Y = 0.0;
    (open->backfloorplane).negiC = -1.0;
    (open->backfloorplane).normal.Z = 1.0;
    (open->backfloorplane).D = 3.4028234663852886e+38;
  }
  if (actor == (AActor *)0x0) {
LAB_00546538:
    open->touchmidtex = false;
    open->abovemidtex = false;
  }
  else {
    bVar2 = SUB41((flags & 8U) >> 3,0);
    P_LineOpening_XFloors(open,actor,linedef,pos->X,pos->Y,bVar2);
    if (((linedef->frontsector == (sector_t *)0x0) || (linedef->backsector == (sector_t *)0x0)) ||
       ((linedef->flags & 0x200000) == 0)) goto LAB_00546538;
    bVar2 = P_LineOpening_3dMidtex(actor,linedef,open,bVar2);
    open->touchmidtex = bVar2;
  }
  dVar8 = open->top - open->bottom;
  dVar9 = 3.4028234663852886e+38;
  if (dVar8 <= 3.4028234663852886e+38) {
    dVar9 = dVar8;
  }
  dVar9 = (double)(~-(ulong)(-3.4028234663852886e+38 < dVar8) & 0xc7efffffe0000000 |
                  (ulong)dVar9 & -(ulong)(-3.4028234663852886e+38 < dVar8));
LAB_0054656f:
  open->range = dVar9;
  return;
}

Assistant:

void P_LineOpening (FLineOpening &open, AActor *actor, const line_t *linedef, const DVector2 &pos, const DVector2 *ref, int flags)
{
	if (!(flags & FFCF_ONLY3DFLOORS))
	{
		sector_t *front, *back;
		double fc = 0, ff = 0, bc = 0, bf = 0;

		if (linedef->backsector == NULL)
		{
			// single sided line
			open.range = 0;
			return;
		}

		front = linedef->frontsector;
		back = linedef->backsector;

		if (!(flags & FFCF_NOPORTALS) && (linedef->flags & ML_PORTALCONNECT))
		{
			if (!linedef->frontsector->PortalBlocksMovement(sector_t::ceiling)) fc = LINEOPEN_MAX;
			if (!linedef->backsector->PortalBlocksMovement(sector_t::ceiling)) bc = LINEOPEN_MAX;
			if (!linedef->frontsector->PortalBlocksMovement(sector_t::floor)) ff = LINEOPEN_MIN;
			if (!linedef->backsector->PortalBlocksMovement(sector_t::floor)) bf = LINEOPEN_MIN;
		}

		if (fc == 0) fc = front->ceilingplane.ZatPoint(pos);
		if (bc == 0) bc = back->ceilingplane.ZatPoint(pos);
		if (ff == 0) ff = front->floorplane.ZatPoint(pos);
		if (bf == 0) bf = back->floorplane.ZatPoint(pos);


		/*Printf ("]]]]]] %d %d\n", ff, bf);*/

		open.topsec = fc < bc? front : back;
		open.ceilingpic = open.topsec->GetTexture(sector_t::ceiling);
		open.top = fc < bc ? fc : bc;

		bool usefront;

		// [RH] fudge a bit for actors that are moving across lines
		// bordering a slope/non-slope that meet on the floor. Note
		// that imprecisions in the plane equation mean there is a
		// good chance that even if a slope and non-slope look like
		// they line up, they won't be perfectly aligned.
		if (ff == -FLT_MIN || bf == -FLT_MIN || ref == NULL || fabs (ff-bf) > 1./256)
		{
			usefront = (ff > bf);
		}
		else
		{
			if (!front->floorplane.isSlope())
				usefront = true;
			else if (!back->floorplane.isSlope())
				usefront = false;
			else
				usefront = !P_PointOnLineSide (*ref, linedef);
		}

		if (usefront)
		{
			open.bottom = ff;
			open.bottomsec = front;
			open.floorpic = front->GetTexture(sector_t::floor);
			open.floorterrain = front->GetTerrain(sector_t::floor);
			if (bf != -FLT_MIN) open.lowfloor = bf;
			else if (!(flags & FFCF_NODROPOFF))
			{
				// We must check through the portal for the actual dropoff.
				// If there's no lines in the lower sections we'd never get a usable value otherwise.
				open.lowfloor = back->NextLowestFloorAt(pos.X, pos.Y, back->GetPortalPlaneZ(sector_t::floor) - EQUAL_EPSILON);
			}
		}
		else
		{
			open.bottom = bf;
			open.bottomsec = back;
			open.floorpic = back->GetTexture(sector_t::floor);
			open.floorterrain = back->GetTerrain(sector_t::floor);
			if (ff != -FLT_MIN) open.lowfloor = ff;
			else if (!(flags & FFCF_NODROPOFF))
			{
				// We must check through the portal for the actual dropoff.
				// If there's no lines in the lower sections we'd never get a usable value otherwise.
				open.lowfloor = front->NextLowestFloorAt(pos.X, pos.Y, front->GetPortalPlaneZ(sector_t::floor) - EQUAL_EPSILON);
			}
		}
		open.frontfloorplane = front->floorplane;
		open.backfloorplane = back->floorplane;
	}
	else
	{ // Dummy stuff to have some sort of opening for the 3D checks to modify
		open.topsec = NULL;
		open.ceilingpic.SetInvalid();
		open.top = LINEOPEN_MAX;
		open.bottomsec = NULL;
		open.floorpic.SetInvalid();
		open.floorterrain = -1;
		open.bottom = LINEOPEN_MIN;
		open.lowfloor = LINEOPEN_MAX;
		open.frontfloorplane.SetAtHeight(LINEOPEN_MIN, sector_t::floor);
		open.backfloorplane.SetAtHeight(LINEOPEN_MIN, sector_t::floor);
	}

	// Check 3D floors
	if (actor != NULL)
	{
		P_LineOpening_XFloors(open, actor, linedef, pos.X, pos.Y, !!(flags & FFCF_3DRESTRICT));
	}

	if (actor != NULL && linedef->frontsector != NULL && linedef->backsector != NULL && 
		linedef->flags & ML_3DMIDTEX)
	{
		open.touchmidtex = P_LineOpening_3dMidtex(actor, linedef, open, !!(flags & FFCF_3DRESTRICT));
	}
	else
	{
		open.abovemidtex = open.touchmidtex = false;
	}

	// avoid overflows in the opening.
	open.range = clamp(open.top - open.bottom, LINEOPEN_MIN, LINEOPEN_MAX);
}